

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QRegion __thiscall QListView::visualRegionForSelection(QListView *this,QItemSelection *selection)

{
  undefined4 uVar1;
  QItemSelectionRange *pQVar2;
  long lVar3;
  QPersistentModelIndexData *pQVar4;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *pDVar5
  ;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  QPersistentModelIndex *this_00;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar14;
  undefined8 uVar15;
  long in_RDX;
  undefined8 extraout_RDX;
  int iVar16;
  int r;
  QItemSelectionRange *pQVar17;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  bool bVar18;
  undefined1 auVar19 [16];
  Bucket BVar20;
  QRect local_c8;
  QModelIndex local_b8;
  QRect local_98;
  QPersistentModelIndex local_88;
  QPersistentModelIndex local_80;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
  uVar1 = *(undefined4 *)&pQVar2[0x59].tl.d;
  *(undefined1 **)
   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
       &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  auVar19._8_8_ = local_78.i;
  auVar19._0_4_ = local_78.r;
  auVar19._4_4_ = local_78.c;
  lVar3 = *(long *)(pQVar2[0x2b].tl.d + 0x20);
  local_98.x2.m_i = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
  local_98.y2.m_i = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
  local_98.x1.m_i = 0;
  local_98.y1.m_i = 0;
  if (*(long *)(in_RDX + 0x10) != 0) {
    this_01 = *(QItemSelectionRange **)(in_RDX + 8);
    pQVar17 = this_01 + *(long *)(in_RDX + 0x10);
    this_00 = &pQVar2[0x3b].br;
    do {
      local_78._0_16_ = auVar19;
      bVar10 = QItemSelectionRange::isValid(this_01);
      auVar19 = (undefined1  [16])local_78._0_16_;
      if (bVar10) {
        local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent();
        cVar11 = comparesEqual(this_00,&local_b8);
        auVar19 = (undefined1  [16])local_78._0_16_;
        if (cVar11 != '\0') {
          iVar12 = QPersistentModelIndex::row();
          iVar13 = QPersistentModelIndex::row();
          if ((*(int *)&pQVar2[0x56].br.d == 1) || (*(char *)&pQVar2[0x54].br.d != '\0')) {
            auVar19 = (undefined1  [16])local_78._0_16_;
            if (iVar12 <= iVar13) {
              do {
                pQVar4 = pQVar2[0x2f].br.d;
                (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar12,uVar1,&local_b8);
                auVar19 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].
                                       super_QArrayData)(selection,&local_58);
                local_78._0_16_ = auVar19;
                cVar11 = QRect::intersects(&local_98);
                if (cVar11 != '\0') {
                  QRegion::operator+=((QRegion *)this,(QRect *)&local_78);
                }
                iVar12 = iVar12 + 1;
                auVar19 = (undefined1  [16])local_78._0_16_;
              } while (iVar13 + 1 != iVar12);
            }
          }
          else {
            auVar7 = (undefined1  [16])local_78._0_16_;
            if (iVar12 <= iVar13) {
              do {
                local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
                pQVar4 = pQVar2[0x2f].br.d;
                QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
                bVar10 = false;
                (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar12,0,&local_58);
                local_58.m.ptr = local_78.m.ptr;
                local_58.r = local_78.r;
                local_58.c = local_78.c;
                local_58.i = local_78.i;
                pDVar5 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           **)(*(long *)(pQVar2[0x2f].br.d + 8) + 0x90);
                if (pDVar5 != (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                               *)0x0) {
                  BVar20 = QHashPrivate::
                           Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           ::findBucket<QtPrivate::QModelIndexWrapper>
                                     (pDVar5,(QModelIndexWrapper *)&local_58);
                  if (BVar20.span[BVar20.index] == (Span)0xff) {
                    bVar10 = false;
                  }
                  else {
                    bVar10 = *(long *)(BVar20.span + 0x80) != 0;
                  }
                }
                if (bVar10) {
                  QPersistentModelIndex::QPersistentModelIndex(&local_88,&local_78);
                  pDVar6 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                           pQVar2[0x58].br.d;
                  if (pDVar6 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *
                                )0x0) goto LAB_0057944d;
                  pNVar14 = QHashPrivate::
                            Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                            findNode<QPersistentModelIndex>(pDVar6,&local_88);
                  bVar18 = pNVar14 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
                }
                else {
LAB_0057944d:
                  bVar18 = false;
                }
                if (bVar10) {
                  QPersistentModelIndex::~QPersistentModelIndex(&local_88);
                }
                auVar8._8_8_ = local_78.i;
                auVar8._0_4_ = local_78.r;
                auVar8._4_4_ = local_78.c;
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
              } while ((bVar18) && (iVar12 = iVar12 + 1, auVar7 = auVar8, iVar13 + 1 != iVar12));
            }
            if (iVar12 <= iVar13) {
              do {
                local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
                pQVar4 = pQVar2[0x2f].br.d;
                QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
                bVar10 = false;
                (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar13,0,&local_58);
                local_58.m.ptr = local_78.m.ptr;
                local_58.r = local_78.r;
                local_58.c = local_78.c;
                local_58.i = local_78.i;
                pDVar5 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           **)(*(long *)(pQVar2[0x2f].br.d + 8) + 0x90);
                if (pDVar5 != (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                               *)0x0) {
                  BVar20 = QHashPrivate::
                           Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           ::findBucket<QtPrivate::QModelIndexWrapper>
                                     (pDVar5,(QModelIndexWrapper *)&local_58);
                  if (BVar20.span[BVar20.index] == (Span)0xff) {
                    bVar10 = false;
                  }
                  else {
                    bVar10 = *(long *)(BVar20.span + 0x80) != 0;
                  }
                }
                if (bVar10) {
                  QPersistentModelIndex::QPersistentModelIndex(&local_80,&local_78);
                  pDVar6 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                           pQVar2[0x58].br.d;
                  if (pDVar6 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *
                                )0x0) goto LAB_00579573;
                  pNVar14 = QHashPrivate::
                            Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                            findNode<QPersistentModelIndex>(pDVar6,&local_80);
                  bVar18 = pNVar14 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
                }
                else {
LAB_00579573:
                  bVar18 = false;
                }
                if (bVar10) {
                  QPersistentModelIndex::~QPersistentModelIndex(&local_80);
                }
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
                auVar9._8_8_ = local_78.i;
                auVar9._0_4_ = local_78.r;
                auVar9._4_4_ = local_78.c;
              } while ((bVar18) &&
                      (iVar16 = iVar13 + -1, bVar10 = iVar12 < iVar13, iVar13 = iVar16,
                      auVar7 = auVar9, bVar10));
            }
            local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            pQVar4 = pQVar2[0x2f].br.d;
            local_78._0_16_ = auVar7;
            (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar12,uVar1,&local_b8);
            local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            pQVar4 = pQVar2[0x2f].br.d;
            (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar13,uVar1,&local_b8);
            local_c8.x1.m_i = -0x55555556;
            local_c8.y1.m_i = -0x55555556;
            local_c8.x2.m_i = -0x55555556;
            local_c8.y2.m_i = -0x55555556;
            uVar15 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].
                                  super_QArrayData)(selection,&local_58);
            (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                      (selection,&local_78);
            local_c8.x1.m_i = (int)uVar15;
            local_c8.y1.m_i = (int)((ulong)uVar15 >> 0x20);
            local_c8.x2.m_i = (int)extraout_RDX;
            local_c8.y2.m_i = (int)((ulong)extraout_RDX >> 0x20);
            cVar11 = QRect::intersects(&local_98);
            auVar19._8_8_ = local_78.i;
            auVar19._0_4_ = local_78.r;
            auVar19._4_4_ = local_78.c;
            if (cVar11 != '\0') {
              QRegion::operator+=((QRegion *)this,&local_c8);
              auVar19._8_8_ = local_78.i;
              auVar19._0_4_ = local_78.r;
              auVar19._4_4_ = local_78.c;
            }
          }
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pQVar17);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_78._0_16_ = auVar19;
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QListView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QListView);
    // ### NOTE: this is a potential bottleneck in non-static mode
    int c = d->column;
    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &elem : selection) {
        if (!elem.isValid())
            continue;
        QModelIndex parent = elem.topLeft().parent();
        //we only display the children of the root in a listview
        //we're not interested in the other model indexes
        if (parent != d->root)
            continue;
        int t = elem.topLeft().row();
        int b = elem.bottomRight().row();
        if (d->viewMode == IconMode || d->isWrapping()) { // in non-static mode, we have to go through all selected items
            for (int r = t; r <= b; ++r) {
                const QRect &rect = visualRect(d->model->index(r, c, parent));
                if (viewportRect.intersects(rect))
                    selectionRegion += rect;
            }
        } else { // in static mode, we can optimize a bit
            while (t <= b && d->isHidden(t)) ++t;
            while (b >= t && d->isHidden(b)) --b;
            const QModelIndex top = d->model->index(t, c, parent);
            const QModelIndex bottom = d->model->index(b, c, parent);
            QRect rect(visualRect(top).topLeft(),
                       visualRect(bottom).bottomRight());
            if (viewportRect.intersects(rect))
                selectionRegion += rect;
        }
    }

    return selectionRegion;
}